

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  uint uVar12;
  
  uVar4 = (uint)value;
  pbVar9 = (byte *)text._M_len;
  *(int *)text._M_str = 0;
  if (pbVar9 != (byte *)0x0) {
    pbVar11 = pbVar9;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[*pbVar11] & 8) == 0) break;
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 < pbVar9 + (long)this);
    }
    do {
      if (pbVar9 + (long)this <= pbVar11) {
        return false;
      }
      pbVar6 = pbVar9 + -1 + (long)this;
      this = this + -1;
    } while (((&ascii_internal::kPropertyBits)[*pbVar6] & 8) != 0);
    bVar1 = *pbVar11;
    pbVar6 = pbVar9 + (long)this + 1;
    if (((bVar1 != 0x2d) && (bVar1 != 0x2b)) || (pbVar11 = pbVar11 + 1, pbVar11 < pbVar6)) {
      if (uVar4 == 0x10) {
        pbVar7 = pbVar9 + (long)this + 1;
        uVar4 = 0x10;
        if (((1 < (long)(pbVar9 + (long)this + (1 - (long)pbVar11))) && (*pbVar11 == 0x30)) &&
           (((pbVar11[1] | 0x20) == 0x78 && (pbVar11 = pbVar11 + 2, pbVar6 <= pbVar11)))) {
          return false;
        }
      }
      else if (uVar4 == 0) {
        pbVar7 = pbVar9 + (long)this + 1;
        if (((long)(pbVar9 + (long)this) - (long)pbVar11) + 1 < 2) {
          uVar4 = 10;
          if ((long)(pbVar9 + (long)this) - (long)pbVar11 == 0) {
            bVar2 = *pbVar11;
            pbVar11 = pbVar11 + (bVar2 == 0x30);
            uVar4 = (uint)(bVar2 != 0x30) * 2 + 8;
          }
        }
        else if (*pbVar11 == 0x30) {
          if ((pbVar11[1] | 0x20) == 0x78) {
            pbVar11 = pbVar11 + 2;
            if (pbVar6 <= pbVar11) {
              return false;
            }
            uVar4 = 0x10;
          }
          else {
            pbVar11 = pbVar11 + 1;
            uVar4 = 8;
          }
        }
        else {
          uVar4 = 10;
        }
      }
      else {
        pbVar7 = pbVar6;
        if (0x22 < uVar4 - 2) {
          return false;
        }
      }
      lVar8 = (long)pbVar7 - (long)pbVar11;
      uVar10 = (ulong)uVar4;
      if (bVar1 == 0x2d) {
        iVar5 = 0;
        if ((int)(0x80000000 / uVar10) +
            *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + uVar10 * 4) != 0) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                        ,0x404,
                        "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                       );
        }
        bVar3 = true;
        if (0 < lVar8) {
          pbVar9 = pbVar11 + lVar8;
          iVar5 = 0;
          do {
            uVar12 = (uint)(char)(anonymous_namespace)::kAsciiToInt[*pbVar11];
            if ((int)uVar4 <= (int)uVar12) goto LAB_001a180f;
            if ((iVar5 < *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase +
                                 uVar10 * 4)) || ((int)(iVar5 * uVar4) < (int)(uVar12 | 0x80000000))
               ) {
              bVar3 = false;
              iVar5 = -0x80000000;
              break;
            }
            iVar5 = iVar5 * uVar4 - uVar12;
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 < pbVar9);
        }
      }
      else {
        iVar5 = 0;
        if ((int)(0x7fffffff / uVar10) !=
            *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + uVar10 * 4)) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                        ,0x3e1,
                        "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                       );
        }
        bVar3 = true;
        if (0 < lVar8) {
          pbVar9 = pbVar11 + lVar8;
          iVar5 = 0;
          do {
            uVar12 = (uint)(char)(anonymous_namespace)::kAsciiToInt[*pbVar11];
            if ((int)uVar4 <= (int)uVar12) goto LAB_001a180f;
            if ((*(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + uVar10 * 4) <
                 iVar5) || ((int)(uVar12 ^ 0x7fffffff) < (int)(iVar5 * uVar4))) {
              bVar3 = false;
              iVar5 = 0x7fffffff;
              break;
            }
            iVar5 = iVar5 * uVar4 + uVar12;
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 < pbVar9);
        }
      }
      goto LAB_001a1823;
    }
  }
  return false;
LAB_001a180f:
  bVar3 = false;
LAB_001a1823:
  *(int *)text._M_str = iVar5;
  return bVar3;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* absl_nonnull value,
                       int base) {
  return safe_int_internal<int32_t>(text, value, base);
}